

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::optional<nonius::run_configuration>::destroy(optional<nonius::run_configuration> *this)

{
  optional<nonius::run_configuration> *in_RDI;
  
  if ((in_RDI->initialized & 1U) != 0) {
    get_impl(in_RDI);
    run_configuration::~run_configuration((run_configuration *)in_RDI);
    in_RDI->initialized = false;
  }
  return;
}

Assistant:

void destroy() {
            if (initialized) {
                get_impl().~T();
                initialized = false;
            }
        }